

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

ostream * Logger::GetStream(LogSeverity severity)

{
  ulong uVar1;
  int in_EDI;
  ostream *local_28;
  ostream *local_20;
  ostream *local_18;
  ostream *local_8;
  
  if (in_EDI == 0) {
    uVar1 = std::ofstream::is_open();
    if ((uVar1 & 1) == 0) {
      local_18 = (ostream *)&std::cout;
    }
    else {
      local_18 = (ostream *)info_log_file_;
    }
    local_8 = local_18;
  }
  else if (in_EDI == 1) {
    uVar1 = std::ofstream::is_open();
    if ((uVar1 & 1) == 0) {
      local_20 = (ostream *)&std::cerr;
    }
    else {
      local_20 = (ostream *)warn_log_file_;
    }
    local_8 = local_20;
  }
  else if ((in_EDI == 2) || (in_EDI == 3)) {
    uVar1 = std::ofstream::is_open();
    if ((uVar1 & 1) == 0) {
      local_28 = (ostream *)&std::cerr;
    }
    else {
      local_28 = (ostream *)erro_log_file_;
    }
    local_8 = local_28;
  }
  else {
    local_8 = (ostream *)&std::cout;
  }
  return local_8;
}

Assistant:

std::ostream& Logger::GetStream(LogSeverity severity) {
  if (severity == INFO) {
    return info_log_file_.is_open() ? info_log_file_ : std::cout;
  } else if (severity == WARNING) {
    return warn_log_file_.is_open() ? warn_log_file_ : std::cerr;
  } else if (severity == ERR || severity == FATAL) {
    return erro_log_file_.is_open() ? erro_log_file_ : std::cerr;
  }
  return std::cout; // Print message
}